

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

double __thiscall asmjit::FileLogger::_log(FileLogger *this,double __x)

{
  size_t in_RDX;
  char *in_RSI;
  double extraout_XMM0_Qa;
  size_t local_20;
  
  if (this->_stream != (FILE *)0x0) {
    local_20 = in_RDX;
    if (in_RDX == 0xffffffffffffffff) {
      local_20 = strlen(in_RSI);
    }
    fwrite(in_RSI,1,local_20,(FILE *)this->_stream);
    __x = extraout_XMM0_Qa;
  }
  return __x;
}

Assistant:

Error FileLogger::_log(const char* buf, size_t len) noexcept {
  if (!_stream)
    return kErrorOk;

  if (len == Globals::kInvalidIndex)
    len = strlen(buf);

  fwrite(buf, 1, len, _stream);
  return kErrorOk;
}